

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_object_base_break(parser *p)

{
  long lVar1;
  wchar_t wVar2;
  void *pvVar3;
  kb_parsedata *d;
  object_base *kb;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    lVar1 = *(long *)((long)pvVar3 + 0x98);
    if (lVar1 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      wVar2 = parser_getint(p,"breakage");
      *(wchar_t *)(lVar1 + 0x88) = wVar2;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("d",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                ,0x226,"enum parser_error parse_object_base_break(struct parser *)");
}

Assistant:

static enum parser_error parse_object_base_break(struct parser *p) {
	struct object_base *kb;
	struct kb_parsedata *d = parser_priv(p);

	assert(d);
	kb = d->kb;
	if (!kb) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	kb->break_perc = parser_getint(p, "breakage");
	return PARSE_ERROR_NONE;
}